

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.h
# Opt level: O2

void cpu_get_tb_cpu_state
               (CPUS390XState_conflict *env,target_ulong *pc,target_ulong *cs_base,uint32_t *flags)

{
  uint uVar1;
  
  *pc = (env->psw).addr;
  *cs_base = env->ex_value;
  uVar1 = (uint)((env->psw).mask >> 0x1f) & 0x88038003;
  *flags = uVar1;
  if ((env->cregs[0] & 0x60000) != 0) {
    *flags = ((uint)env->cregs[0] & 0x60000) << 0xc | uVar1;
  }
  return;
}

Assistant:

static inline void cpu_get_tb_cpu_state(CPUSPARCState *env, target_ulong *pc,
                                        target_ulong *cs_base, uint32_t *pflags)
{
    uint32_t flags;
    *pc = env->pc;
    *cs_base = env->npc;
    flags = cpu_mmu_index(env, false);
    if (cpu_supervisor_mode(env)) {
        flags |= TB_FLAG_SUPER;
    }
#ifdef TARGET_SPARC64
    if (env->pstate & PS_AM) {
        flags |= TB_FLAG_AM_ENABLED;
    }
    if ((env->def.features & CPU_FEATURE_FLOAT)
        && (env->pstate & PS_PEF)
        && (env->fprs & FPRS_FEF)) {
        flags |= TB_FLAG_FPU_ENABLED;
    }
    flags |= env->asi << TB_FLAG_ASI_SHIFT;
#else
    if ((env->def.features & CPU_FEATURE_FLOAT) && env->psref) {
        flags |= TB_FLAG_FPU_ENABLED;
    }
#endif
    *pflags = flags;
}